

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O0

RPCHelpMan * validateaddress(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffef38;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar1;
  allocator<RPCResult> *paVar2;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffef40;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffef48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef70;
  allocator<char> *in_stack_ffffffffffffef78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef80;
  undefined7 in_stack_ffffffffffffef88;
  undefined1 in_stack_ffffffffffffef8f;
  string *in_stack_ffffffffffffef90;
  undefined7 in_stack_ffffffffffffef98;
  undefined1 in_stack_ffffffffffffef9f;
  undefined4 in_stack_ffffffffffffefa0;
  Type in_stack_ffffffffffffefa4;
  string *in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefb0;
  Type in_stack_ffffffffffffefb4;
  undefined4 in_stack_ffffffffffffefb8;
  Type in_stack_ffffffffffffefbc;
  RPCResult *in_stack_ffffffffffffefc0;
  undefined1 *local_1028;
  undefined1 *local_1010;
  undefined1 *local_ff8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_de0 [37];
  allocator<char> local_dbb [3];
  pointer local_db8;
  pointer pRStack_db0;
  pointer local_da8;
  allocator<char> local_d9a;
  allocator<char> local_d99 [31];
  allocator<char> local_d7a;
  allocator<char> local_d79 [31];
  allocator<char> local_d5a;
  undefined1 local_d59 [31];
  undefined1 local_d3a;
  undefined1 local_d39 [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d30;
  allocator<char> local_d1a;
  allocator<char> local_d19;
  _Alloc_hider local_d18;
  size_type sStack_d10;
  undefined1 local_d08 [15];
  allocator<char> local_cf9;
  pointer local_cf8;
  pointer pbStack_cf0;
  pointer local_ce8;
  allocator<char> local_cda;
  allocator<char> local_cd9;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  allocator<char> local_cba;
  allocator<char> local_cb9;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  allocator<char> local_c9a;
  allocator<char> local_c99;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  allocator<char> local_c7a;
  allocator<char> local_c79 [31];
  allocator<char> local_c5a;
  allocator<char> local_c59 [32];
  allocator<char> local_c39;
  undefined4 local_c38;
  allocator<char> local_c31 [31];
  allocator<char> local_c12;
  RPCMethodImpl local_c11 [12];
  undefined1 local_a90 [136];
  undefined1 local_a08 [576];
  undefined1 local_7c8 [816];
  string local_498 [12];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fun = local_c11;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_c38 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffef48,(Optional *)in_stack_ffffffffffffef40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffef50);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffef38);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                 in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
                 in_stack_ffffffffffffef90,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffef38);
  __l._M_len._0_7_ = in_stack_ffffffffffffef88;
  __l._M_array = (iterator)in_stack_ffffffffffffef80;
  __l._M_len._7_1_ = in_stack_ffffffffffffef8f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef78,__l,
             (allocator_type *)in_stack_ffffffffffffef70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_c98 = 0;
  uStack_c90 = 0;
  local_c88 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef38);
  RPCResult::RPCResult
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
             (string *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
             in_stack_ffffffffffffefa8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
             (bool)in_stack_ffffffffffffef9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_cb8 = 0;
  uStack_cb0 = 0;
  local_ca8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef38);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffef38 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb4,in_stack_ffffffffffffefa8,
             SUB41(in_stack_ffffffffffffefa4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef90,
             (bool)in_stack_ffffffffffffef8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_cd8 = 0;
  uStack_cd0 = 0;
  local_cc8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb4,in_stack_ffffffffffffefa8,
             SUB41(in_stack_ffffffffffffefa4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef90,
             (bool)in_stack_ffffffffffffef8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_cf8 = (pointer)0x0;
  pbStack_cf0 = (pointer)0x0;
  local_ce8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb4,in_stack_ffffffffffffefa8,
             SUB41(in_stack_ffffffffffffefa4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef90,
             (bool)in_stack_ffffffffffffef8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_d18._M_p = (pointer)0x0;
  sStack_d10 = 0;
  local_d08._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb4,in_stack_ffffffffffffefa8,
             SUB41(in_stack_ffffffffffffefa4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef90,
             (bool)in_stack_ffffffffffffef8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_d39._1_8_ = 0;
  aStack_d30._M_allocated_capacity = 0;
  aStack_d30._8_8_ = 0;
  this_00 = (RPCHelpMan *)(local_d39 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb4,in_stack_ffffffffffffefa8,
             SUB41(in_stack_ffffffffffffefa4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef90,
             (bool)in_stack_ffffffffffffef8f);
  description = local_498;
  name = (string *)local_d39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_d3a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_d59._1_8_ = 0;
  local_d59._9_8_ = 0;
  local_d59._17_8_ = 0;
  results = (RPCResults *)(local_d59 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb4,in_stack_ffffffffffffefa8,
             SUB41(in_stack_ffffffffffffefa4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef90,
             (bool)in_stack_ffffffffffffef8f);
  examples = (RPCExamples *)local_d59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_d79[1] = (allocator<char>)0x0;
  local_d79[2] = (allocator<char>)0x0;
  local_d79[3] = (allocator<char>)0x0;
  local_d79[4] = (allocator<char>)0x0;
  local_d79[5] = (allocator<char>)0x0;
  local_d79[6] = (allocator<char>)0x0;
  local_d79[7] = (allocator<char>)0x0;
  local_d79[8] = (allocator<char>)0x0;
  local_d79[9] = (allocator<char>)0x0;
  local_d79[10] = (allocator<char>)0x0;
  local_d79[0xb] = (allocator<char>)0x0;
  local_d79[0xc] = (allocator<char>)0x0;
  local_d79[0xd] = (allocator<char>)0x0;
  local_d79[0xe] = (allocator<char>)0x0;
  local_d79[0xf] = (allocator<char>)0x0;
  local_d79[0x10] = (allocator<char>)0x0;
  local_d79[0x11] = (allocator<char>)0x0;
  local_d79[0x12] = (allocator<char>)0x0;
  local_d79[0x13] = (allocator<char>)0x0;
  local_d79[0x14] = (allocator<char>)0x0;
  local_d79[0x15] = (allocator<char>)0x0;
  local_d79[0x16] = (allocator<char>)0x0;
  local_d79[0x17] = (allocator<char>)0x0;
  local_d79[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  paVar2 = (allocator<RPCResult> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb4,in_stack_ffffffffffffefa8,
             SUB41(in_stack_ffffffffffffefa4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef90,
             (bool)in_stack_ffffffffffffef8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  local_db8 = (pointer)0x0;
  pRStack_db0 = (pointer)0x0;
  local_da8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
             (string *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
             in_stack_ffffffffffffefa8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
             (bool)in_stack_ffffffffffffef9f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffef88;
  __l_00._M_array = (iterator)in_stack_ffffffffffffef80;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffef8f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef78,__l_00,
             (allocator_type *)in_stack_ffffffffffffef70);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb4,in_stack_ffffffffffffefa8,
             SUB41(in_stack_ffffffffffffefa4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef90,
             (bool)in_stack_ffffffffffffef8f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffef88;
  __l_01._M_array = (iterator)in_stack_ffffffffffffef80;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffef8f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef78,__l_01,
             (allocator_type *)in_stack_ffffffffffffef70);
  RPCResult::RPCResult
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefbc,
             (string *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
             in_stack_ffffffffffffefa8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
             (bool)in_stack_ffffffffffffef9f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                 in_stack_ffffffffffffef80);
  std::operator+(in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48);
  HelpExampleCli(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (char *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
                 in_stack_ffffffffffffef80);
  std::operator+(in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48);
  HelpExampleRpc(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
  std::operator+(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
  RPCExamples::RPCExamples((RPCExamples *)paVar2,(string *)0x138b0b2);
  this = (RPCArg *)local_de0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<validateaddress()::__0,void>(in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_de0 + 0x24));
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_dbb);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_ff8 = local_300;
  do {
    local_ff8 = local_ff8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_ff8 != local_7c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1010 = local_a08;
  do {
    local_1010 = local_1010 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1010 != local_a90);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d99);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d79);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_d59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_d3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_d39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d19);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_d08 + 0xe));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cf9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cd9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_cb9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffef48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_c79);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_c59);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffef48);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1028 = local_48;
  do {
    local_1028 = local_1028 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1028 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c39);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_c31);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_c12);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_c11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan validateaddress()
{
    return RPCHelpMan{
        "validateaddress",
        "\nReturn information about the given bitcoin address.\n",
        {
            {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address to validate"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::BOOL, "isvalid", "If the address is valid or not"},
                {RPCResult::Type::STR, "address", /*optional=*/true, "The bitcoin address validated"},
                {RPCResult::Type::STR_HEX, "scriptPubKey", /*optional=*/true, "The hex-encoded output script generated by the address"},
                {RPCResult::Type::BOOL, "isscript", /*optional=*/true, "If the key is a script"},
                {RPCResult::Type::BOOL, "iswitness", /*optional=*/true, "If the address is a witness address"},
                {RPCResult::Type::NUM, "witness_version", /*optional=*/true, "The version number of the witness program"},
                {RPCResult::Type::STR_HEX, "witness_program", /*optional=*/true, "The hex value of the witness program"},
                {RPCResult::Type::STR, "error", /*optional=*/true, "Error message, if any"},
                {RPCResult::Type::ARR, "error_locations", /*optional=*/true, "Indices of likely error locations in address, if known (e.g. Bech32 errors)",
                    {
                        {RPCResult::Type::NUM, "index", "index of a potential error"},
                    }},
            }
        },
        RPCExamples{
            HelpExampleCli("validateaddress", "\"" + EXAMPLE_ADDRESS[0] + "\"") +
            HelpExampleRpc("validateaddress", "\"" + EXAMPLE_ADDRESS[0] + "\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::string error_msg;
            std::vector<int> error_locations;
            CTxDestination dest = DecodeDestination(request.params[0].get_str(), error_msg, &error_locations);
            const bool isValid = IsValidDestination(dest);
            CHECK_NONFATAL(isValid == error_msg.empty());

            UniValue ret(UniValue::VOBJ);
            ret.pushKV("isvalid", isValid);
            if (isValid) {
                std::string currentAddress = EncodeDestination(dest);
                ret.pushKV("address", currentAddress);

                CScript scriptPubKey = GetScriptForDestination(dest);
                ret.pushKV("scriptPubKey", HexStr(scriptPubKey));

                UniValue detail = DescribeAddress(dest);
                ret.pushKVs(std::move(detail));
            } else {
                UniValue error_indices(UniValue::VARR);
                for (int i : error_locations) error_indices.push_back(i);
                ret.pushKV("error_locations", std::move(error_indices));
                ret.pushKV("error", error_msg);
            }

            return ret;
        },
    };
}